

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O2

void __thiscall
embree::motion_derivative_regression_test::motion_derivative_regression_test
          (motion_derivative_regression_test *this,char *name)

{
  RegressionTest *in_stack_ffffffffffffffc8;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,(allocator *)&stack0xffffffffffffffcf);
  RegressionTest::RegressionTest(&this->super_RegressionTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_021d9438;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(&this->rng);
  registerRegressionTest(in_stack_ffffffffffffffc8);
  return;
}

Assistant:

motion_derivative_regression_test(const char* name) : RegressionTest(name) {
      registerRegressionTest(this);
    }